

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doubling-factor-table.cpp
# Opt level: O1

void __thiscall
mahjong::DoublingFactorTable::DoublingFactorTable
          (DoublingFactorTable *this,PlayerHand *hand,WiningState *state)

{
  map<mahjong::Pattern,_int,_std::less<mahjong::Pattern>,_std::allocator<std::pair<const_mahjong::Pattern,_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  pair<const_mahjong::Pattern,_int> local_20;
  
  this->hand = hand;
  this->state = state;
  this_00 = &this->factor_table;
  p_Var1 = &(this->factor_table)._M_t._M_impl.super__Rb_tree_header;
  (this->factor_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->factor_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->factor_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->factor_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->factor_table)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar2 = PlayerHand::isClosedHand(hand);
  local_20.first = ReadyHand;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = OneShot;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = LastTileFromTheWall;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = LastDiscard;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = DeadWallDraw;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = RobbingQuad;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = SelfDrawn;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = OneSetOfIdenticalSequences;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = NoPointsHand;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = WhiteDragon;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = GreenDragon;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = RedDragon;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = EastWind;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = SouthWind;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = WestWind;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = NorthWind;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = AllSimples;
  local_20.second = 1;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  iVar3 = bVar2 + 1;
  local_20.second = iVar3;
  local_20.first = ThreeColourStraights;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = Straight;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = TerminalOrHonorInEachSet;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = DoubleEastWind;
  local_20.second = 2;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = DoubleSouthWind;
  local_20.second = 2;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = DoubleWestWind;
  local_20.second = 2;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = DoubleNorthWind;
  local_20.second = 2;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = DoubleReady;
  local_20.second = 2;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = SevenPairs;
  local_20.second = 2;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = AllTriplets;
  local_20.second = 2;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = ThreeClosedTriplets;
  local_20.second = 2;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = ThreeColourTriplets;
  local_20.second = 2;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = ThreeQuads;
  local_20.second = 2;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = LittleThreeDragons;
  local_20.second = 2;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = AllTerminalsAndHornors;
  local_20.second = 2;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20 = (pair<const_mahjong::Pattern,_int>)((ulong)CONCAT14(bVar2,0x21) | 0x200000000);
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20 = (pair<const_mahjong::Pattern,_int>)((ulong)CONCAT14(bVar2,0x23) | 0x200000000);
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = TwoSetsOfIdenticalSequences;
  local_20.second = 3;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = Flush;
  local_20.second = 6;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = HeavenlyHand;
  local_20.second = 100;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = EarthlyHand;
  local_20.second = 100;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = FourClosedTriplets;
  local_20.second = 100;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = ThirteenOrphans;
  local_20.second = 100;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = NineGates;
  local_20.second = 100;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = AllGreen;
  local_20.second = 100;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = AllHonors;
  local_20.second = 100;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = AllTerminals;
  local_20.second = 100;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = BigThreeDragons;
  local_20.second = 100;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = LittleFourWinds;
  local_20.second = 100;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = BigFourWinds;
  local_20.second = 100;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  local_20.first = FourQuads;
  local_20.second = 100;
  std::
  _Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
  ::_M_insert_unique<std::pair<mahjong::Pattern_const,int>>
            ((_Rb_tree<mahjong::Pattern,std::pair<mahjong::Pattern_const,int>,std::_Select1st<std::pair<mahjong::Pattern_const,int>>,std::less<mahjong::Pattern>,std::allocator<std::pair<mahjong::Pattern_const,int>>>
              *)this_00,&local_20);
  return;
}

Assistant:

DoublingFactorTable::DoublingFactorTable(const PlayerHand& hand, const WiningState& state)
	: hand(hand)
	, state(state)
{
	auto closed_hand_bonus = 0;
	if (hand.isClosedHand())
	{
		closed_hand_bonus = 1;
	}

	factor_table.insert({ Pattern::ReadyHand, 1 });
	factor_table.insert({ Pattern::OneShot, 1 });
	factor_table.insert({ Pattern::LastTileFromTheWall, 1 });
	factor_table.insert({ Pattern::LastDiscard, 1 });
	factor_table.insert({ Pattern::DeadWallDraw, 1 });
	factor_table.insert({ Pattern::RobbingQuad, 1 });
	factor_table.insert({ Pattern::SelfDrawn, 1 });
	factor_table.insert({ Pattern::OneSetOfIdenticalSequences, 1 });
	factor_table.insert({ Pattern::NoPointsHand, 1 });
	factor_table.insert({ Pattern::WhiteDragon, 1 });
	factor_table.insert({ Pattern::GreenDragon, 1 });
	factor_table.insert({ Pattern::RedDragon, 1 });
	factor_table.insert({ Pattern::EastWind, 1 });
	factor_table.insert({ Pattern::SouthWind, 1 });
	factor_table.insert({ Pattern::WestWind, 1 });
	factor_table.insert({ Pattern::NorthWind, 1 });
	factor_table.insert({ Pattern::AllSimples, 1 });

	factor_table.insert({ Pattern::ThreeColourStraights, 1 + closed_hand_bonus });
	factor_table.insert({ Pattern::Straight, 1 + closed_hand_bonus });
	factor_table.insert({ Pattern::TerminalOrHonorInEachSet, 1 + closed_hand_bonus });

	factor_table.insert({ Pattern::DoubleEastWind, 2 });
	factor_table.insert({ Pattern::DoubleSouthWind, 2 });
	factor_table.insert({ Pattern::DoubleWestWind, 2 });
	factor_table.insert({ Pattern::DoubleNorthWind, 2 });
	factor_table.insert({ Pattern::DoubleReady, 2 });
	factor_table.insert({ Pattern::SevenPairs, 2 });
	factor_table.insert({ Pattern::AllTriplets, 2 });
	factor_table.insert({ Pattern::ThreeClosedTriplets, 2 });
	factor_table.insert({ Pattern::ThreeColourTriplets, 2 });
	factor_table.insert({ Pattern::ThreeQuads, 2 });
	factor_table.insert({ Pattern::LittleThreeDragons, 2 });
	factor_table.insert({ Pattern::AllTerminalsAndHornors, 2 });

	factor_table.insert({ Pattern::HalfFlush, 2 + closed_hand_bonus });
	factor_table.insert({ Pattern::TerminalInEachSet, 2 + closed_hand_bonus });

	factor_table.insert({ Pattern::TwoSetsOfIdenticalSequences, 3 });

	factor_table.insert({ Pattern::Flush, 6 });

	factor_table.insert({ Pattern::HeavenlyHand, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::EarthlyHand, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::FourClosedTriplets, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::ThirteenOrphans, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::NineGates, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::AllGreen, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::AllHonors, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::AllTerminals, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::BigThreeDragons, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::LittleFourWinds, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::BigFourWinds, LIMIT_HAND_FACTOR });
	factor_table.insert({ Pattern::FourQuads, LIMIT_HAND_FACTOR });
}